

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Unser<DataStream,std::vector<wallet::CMerkleTx,std::allocator<wallet::CMerkleTx>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_> *v)

{
  long lVar1;
  pointer pCVar2;
  iterator __position;
  uint64_t uVar3;
  uint64_t __n;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (v->super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar2) {
    (v->super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>)._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  uVar3 = ReadCompactSize<DataStream>(s,true);
  if (uVar3 != 0) {
    __n = 0;
    do {
      uVar4 = __n + 5000000;
      __n = uVar3;
      if (uVar4 < uVar3) {
        __n = uVar4;
      }
      std::vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>::reserve(v,__n);
      while (__position._M_current =
                  (v->super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>).
                  _M_impl.super__Vector_impl_data._M_finish,
            (ulong)((long)__position._M_current -
                   (long)(v->
                         super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>).
                         _M_impl.super__Vector_impl_data._M_start) < __n) {
        if (__position._M_current ==
            (v->super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>::_M_realloc_insert<>
                    (v,__position);
        }
        else {
          (v->super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        ::wallet::CMerkleTx::Unserialize<DataStream>
                  ((v->super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>).
                   _M_impl.super__Vector_impl_data._M_finish + -1,s);
      }
    } while (uVar4 < uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }